

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_stop_times.c
# Opt level: O2

void CGTFS_RecordStopTime(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined **ppuVar6;
  char **ppcVar7;
  byte bVar8;
  stop_time_t a;
  char *field_values [10];
  char *field_names [10];
  
  bVar8 = 0;
  iVar1 = greatest_test_pre("stop_time_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      lVar4 = 10;
      puVar5 = &DAT_00222120;
      ppcVar7 = field_names;
      for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
        *ppcVar7 = (char *)*puVar5;
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        ppcVar7 = ppcVar7 + (ulong)bVar8 * -2 + 1;
      }
      ppuVar6 = &PTR_anon_var_dwarf_2c21_00222170;
      ppcVar7 = field_values;
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *ppcVar7 = *ppuVar6;
        ppuVar6 = ppuVar6 + (ulong)bVar8 * -2 + 1;
        ppcVar7 = ppcVar7 + (ulong)bVar8 * -2 + 1;
      }
      read_stop_time(&a,10,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("AWE1",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x16;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_001221d3:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"AWE1\" != st_1.trip_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t
                          ("00:06:00",a.arrival_time,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x17;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001221d3;
          greatest_info.msg = "\"00:06:00\" != st_1.arrival_time";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = greatest_do_assert_equal_t
                            ("00:06:30",a.departure_time,&greatest_type_info_string,(void *)0x0);
          if (iVar2 == 0) {
            greatest_info.fail_line = 0x18;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001221d3;
            greatest_info.msg = "\"00:06:30\" != st_1.departure_time";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar2 = greatest_do_assert_equal_t
                              ("ST_666",a.stop_id,&greatest_type_info_string,(void *)0x0);
            if (iVar2 == 0) {
              greatest_info.fail_line = 0x19;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001221d3;
              greatest_info.msg = "\"ST_666\" != st_1.stop_id";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar2 = greatest_do_assert_equal_t
                                ("Argent D\'Nur",a.stop_headsign,&greatest_type_info_string,
                                 (void *)0x0);
              if (iVar2 == 0) {
                greatest_info.fail_line = 0x1a;
                if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001221d3;
                greatest_info.msg = "\"Argent D\'Nur\" != st_1.stop_headsign";
              }
              else if (a.stop_sequence == 1) {
                if (a.pickup_type == ST_NOT_AVAILABLE) {
                  if (a.dropoff_type == ST_CONTACT_AGENCY) {
                    if ((a.shape_dist_traveled != 6.8315) || (NAN(a.shape_dist_traveled))) {
                      greatest_info.fail_line = 0x1e;
                      greatest_info.msg = "6.8315 != st_1.shape_dist_traveled";
                      greatest_info.assertions = greatest_info.assertions + 4;
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 5;
                      if (a.timepoint == TP_EXACT) {
                        greatest_info.msg = (char *)0x0;
                        iVar1 = 0;
                        goto LAB_001221f0;
                      }
                      greatest_info.fail_line = 0x1f;
                      greatest_info.msg = "TP_EXACT != st_1.timepoint";
                    }
                  }
                  else {
                    greatest_info.fail_line = 0x1d;
                    greatest_info.msg = "ST_CONTACT_AGENCY != st_1.dropoff_type";
                    greatest_info.assertions = greatest_info.assertions + 3;
                  }
                }
                else {
                  greatest_info.fail_line = 0x1c;
                  greatest_info.msg = "ST_NOT_AVAILABLE != st_1.pickup_type";
                  greatest_info.assertions = greatest_info.assertions + 2;
                }
              }
              else {
                greatest_info.fail_line = 0x1b;
                greatest_info.msg = "1 != st_1.stop_sequence";
                greatest_info.assertions = greatest_info.assertions + 1;
              }
            }
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stop_times.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00122406;
    }
LAB_001221f0:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("stop_time_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&a,"trip 0",0xf0);
    memcpy((stop_time_t *)field_names,"trip 0",0xf0);
    memcpy(field_values,"trip 1",0xf0);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_stop_time(&a,(stop_time_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_stop_time(&a,(stop_time_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_stop_time((stop_time_t *)field_names,(stop_time_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_001222f3;
        }
        greatest_info.fail_line = 0x4e;
        greatest_info.msg = "0 != equal_stop_time(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x4d;
        greatest_info.msg = "0 != equal_stop_time(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x4c;
      greatest_info.msg = "1 != equal_stop_time(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stop_times.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_00122406:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stop_times.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_001222f3:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordStopTime) {
    RUN_TEST(stop_time_read);
    RUN_TEST(stop_time_compare);
}